

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O2

void __thiscall prometheus::Histogram::~Histogram(Histogram *this)

{
  std::_Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>::~_Vector_base
            (&(this->bucket_counts_).
              super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

class PROMETHEUS_CPP_CORE_EXPORT Histogram {
 public:
  using BucketBoundaries = std::vector<double>;

  static const MetricType metric_type{MetricType::Histogram};

  /// \brief Create a histogram with manually chosen buckets.
  ///
  /// The BucketBoundaries are a list of monotonically increasing values
  /// representing the bucket boundaries. Each consecutive pair of values is
  /// interpreted as a half-open interval [b_n, b_n+1) which defines one bucket.
  ///
  /// There is no limitation on how the buckets are divided, i.e, equal size,
  /// exponential etc..
  ///
  /// The bucket boundaries cannot be changed once the histogram is created.
  explicit Histogram(const BucketBoundaries& buckets);

  /// \copydoc Histogram::Histogram(const BucketBoundaries&)
  explicit Histogram(BucketBoundaries&& buckets);

  /// \brief Observe the given amount.
  ///
  /// The given amount selects the 'observed' bucket. The observed bucket is
  /// chosen for which the given amount falls into the half-open interval [b_n,
  /// b_n+1). The counter of the observed bucket is incremented. Also the total
  /// sum of all observations is incremented.
  void Observe(double value);

  /// \brief Observe multiple data points.
  ///
  /// Increments counters given a count for each bucket. (i.e. the caller of
  /// this function must have already sorted the values into buckets).
  /// Also increments the total sum of all observations by the given value.
  void ObserveMultiple(const std::vector<double>& bucket_increments,
                       double sum_of_values);

  /// \brief Reset all data points collected so far.
  ///
  /// All buckets and sum are reset to its oringal value. This is especially
  /// useful if histogram is tracked elsewhere but report in prometheus system.
  void Reset();

  /// \brief Get the current value of the histogram.
  ///
  /// Collect is called by the Registry when collecting metrics.
  ClientMetric Collect() const;

 private:
  BucketBoundaries bucket_boundaries_;
  mutable std::mutex mutex_;
  std::vector<Counter> bucket_counts_;
  Gauge sum_;
}